

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O2

void __thiscall
QSidebar::setModelAndUrls(QSidebar *this,QFileSystemModel *model,QList<QUrl> *newUrls)

{
  QUrlModel *this_00;
  QAbstractItemDelegate *delegate;
  QItemSelectionModel *signal;
  QAbstractItemModel *pQVar1;
  long in_FS_OFFSET;
  undefined4 uVar2;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  code *local_58;
  quintptr local_50;
  Object local_38 [8];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QListView::setUniformItemSizes(&this->super_QListView,true);
  this_00 = (QUrlModel *)operator_new(0x68);
  QUrlModel::QUrlModel(this_00,(QObject *)this);
  this->urlModel = this_00;
  QUrlModel::setFileSystemModel(this_00,model);
  (**(code **)(*(long *)&(this->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea.
                         super_QFrame.super_QWidget + 0x1c8))(this,this->urlModel);
  delegate = (QAbstractItemDelegate *)operator_new(0x10);
  QSideBarDelegate::QSideBarDelegate((QSideBarDelegate *)delegate,(QWidget *)this);
  QAbstractItemView::setItemDelegate((QAbstractItemView *)this,delegate);
  signal = QAbstractItemView::selectionModel((QAbstractItemView *)this);
  local_58 = clicked;
  local_50 = 0;
  QObject::
  connect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QSidebar::*)(QModelIndex_const&)>
            (local_38,(offset_in_QItemSelectionModel_to_subr)signal,
             (ContextType *)QItemSelectionModel::currentChanged,(offset_in_QSidebar_to_subr *)0x0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  QAbstractItemView::setDragDropMode((QAbstractItemView *)this,DragDrop);
  QWidget::setContextMenuPolicy((QWidget *)this,CustomContextMenu);
  local_58 = showContextMenu;
  local_50 = 0;
  uVar2 = 0;
  QObject::connect<void(QWidget::*)(QPoint_const&),void(QSidebar::*)(QPoint_const&)>
            ((Object *)&stack0xffffffffffffffc0,(offset_in_QWidget_to_subr)this,
             (ContextType *)QWidget::customContextMenuRequested,(offset_in_QSidebar_to_subr *)0x0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffc0);
  QUrlModel::setUrls(this->urlModel,newUrls);
  pQVar1 = QAbstractItemView::model((QAbstractItemView *)this);
  local_70 = 0xffffffffffffffff;
  local_68 = 0;
  uStack_60 = 0;
  (**(code **)(*(long *)pQVar1 + 0x60))
            ((QModelIndex *)&local_58,pQVar1,0,0,&local_70,*(long *)pQVar1,uVar2);
  QAbstractItemView::setCurrentIndex((QAbstractItemView *)this,(QModelIndex *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSidebar::setModelAndUrls(QFileSystemModel *model, const QList<QUrl> &newUrls)
{
    setUniformItemSizes(true);
    urlModel = new QUrlModel(this);
    urlModel->setFileSystemModel(model);
    setModel(urlModel);
    setItemDelegate(new QSideBarDelegate(this));

    connect(selectionModel(), &QItemSelectionModel::currentChanged,
            this, &QSidebar::clicked);
#if QT_CONFIG(draganddrop)
    setDragDropMode(QAbstractItemView::DragDrop);
#endif
#if QT_CONFIG(menu)
    setContextMenuPolicy(Qt::CustomContextMenu);
    connect(this, &QSidebar::customContextMenuRequested,
            this, &QSidebar::showContextMenu);
#endif
    urlModel->setUrls(newUrls);
    setCurrentIndex(this->model()->index(0,0));
}